

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeFactory.cpp
# Opt level: O0

Executable * ExeFactory::build(AbstractByteBuffer *buf,exe_type type)

{
  mapped_type pEVar1;
  bool bVar2;
  int iVar3;
  mapped_type *ppEVar4;
  undefined4 extraout_var;
  ExeBuilder *builder;
  _Self local_28;
  exe_type local_1c;
  AbstractByteBuffer *pAStack_18;
  exe_type type_local;
  AbstractByteBuffer *buf_local;
  
  local_1c = type;
  pAStack_18 = buf;
  init((EVP_PKEY_CTX *)buf);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
       ::find(&builders,&local_1c);
  builder = (ExeBuilder *)
            std::
            map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
            ::end(&builders);
  bVar2 = std::operator==(&local_28,(_Self *)&builder);
  if (bVar2) {
    buf_local = (AbstractByteBuffer *)0x0;
  }
  else {
    ppEVar4 = std::
              map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
              ::operator[](&builders,&local_1c);
    pEVar1 = *ppEVar4;
    if (pEVar1 == (mapped_type)0x0) {
      buf_local = (AbstractByteBuffer *)0x0;
    }
    else {
      iVar3 = (*pEVar1->_vptr_ExeBuilder[3])(pEVar1,pAStack_18);
      buf_local = (AbstractByteBuffer *)CONCAT44(extraout_var,iVar3);
    }
  }
  return (Executable *)buf_local;
}

Assistant:

Executable* ExeFactory::build(AbstractByteBuffer *buf, exe_type type)
{
    ExeFactory::init(); //ensue that the builders are initialized

    if (builders.find(type) == builders.end()) {
        return NULL;
    }
    ExeBuilder* builder = builders[type];
    if (!builder) return NULL;

    return builder->build(buf);
}